

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

ssize_t httplib::detail::write_response_line(Stream *strm,int status)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  uint uVar3;
  ulong uVar4;
  uint __val;
  uint __len;
  string s;
  string __str;
  long *local_70;
  undefined8 local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_70 = local_60;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"HTTP/1.1 ","");
  __val = -status;
  if (0 < status) {
    __val = status;
  }
  __len = 1;
  if (9 < __val) {
    uVar4 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar3 = (uint)uVar4;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_00169b3c;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_00169b3c;
      }
      if (uVar3 < 10000) goto LAB_00169b3c;
      uVar4 = uVar4 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_00169b3c:
  local_50[0] = local_40;
  ::std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)(status >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)status >> 0x1f) + (long)local_50[0]),__len,__val);
  ::std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50[0]);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  ::std::__cxx11::string::append((char *)&local_70);
  status_message(status);
  ::std::__cxx11::string::append((char *)&local_70);
  ::std::__cxx11::string::append((char *)&local_70);
  iVar2 = (*strm->_vptr_Stream[6])(strm,local_70,local_68);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return CONCAT44(extraout_var,iVar2);
}

Assistant:

inline ssize_t write_response_line(Stream &strm, int status) {
  std::string s = "HTTP/1.1 ";
  s += std::to_string(status);
  s += " ";
  s += httplib::status_message(status);
  s += "\r\n";
  return strm.write(s.data(), s.size());
}